

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O2

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q)

{
  size_t __size;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *__ptr;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong in_R11;
  long lVar20;
  long lVar21;
  uint uVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  double *pdVar29;
  double *pdVar30;
  ulong uVar31;
  bool bVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double *local_138;
  double *local_78;
  ulong local_50;
  
  if (M < N) {
    puts("Rows (M) should be greater than Columns (B) ");
    printf("Retry By Transposing the Input Matrix");
    return -1;
  }
  lVar25 = (long)N;
  __size = lVar25 * 8;
  __ptr = malloc(__size);
  uVar27 = 0;
  dVar33 = macheps();
  uVar8 = (ulong)(uint)(N * M);
  if (N * M < 1) {
    uVar8 = uVar27;
  }
  for (; uVar8 != uVar27; uVar27 = uVar27 + 1) {
    U[uVar27] = A[uVar27];
  }
  lVar23 = (long)M;
  uVar8 = 0;
  if (0 < N) {
    uVar8 = (ulong)(uint)N;
  }
  local_50 = (ulong)(uint)M;
  lVar9 = lVar25 * 8 + 8;
  iVar2 = 1;
  dVar40 = 0.0;
  pdVar11 = U;
  uVar27 = 0;
  dVar35 = 0.0;
  local_78 = U;
  while( true ) {
    uVar19 = uVar27 & 0xffffffff;
    if ((int)uVar27 < M) {
      uVar19 = (ulong)(uint)M;
    }
    if (uVar27 == uVar8) break;
    lVar17 = (long)iVar2;
    pdVar29 = (double *)(lVar9 * lVar17 + (long)U);
    pdVar30 = local_78 + lVar17;
    *(double *)((long)__ptr + uVar27 * 8) = dVar35;
    dVar39 = 0.0;
    pdVar10 = pdVar11;
    uVar12 = local_50;
    while (bVar32 = uVar12 != 0, uVar12 = uVar12 - 1, bVar32) {
      dVar39 = dVar39 + *pdVar10 * *pdVar10;
      pdVar10 = pdVar10 + lVar25;
    }
    dVar34 = 0.0;
    if (dVar33 * dVar33 <= dVar39) {
      iVar1 = (N + 1) * (int)uVar27;
      dVar41 = U[iVar1];
      if (dVar39 < 0.0) {
        dVar34 = sqrt(dVar39);
      }
      else {
        dVar34 = SQRT(dVar39);
      }
      dVar34 = (double)(~-(ulong)(dVar41 < 0.0) & (ulong)-dVar34 |
                       -(ulong)(dVar41 < 0.0) & (ulong)dVar34);
      U[iVar1] = dVar41 - dVar34;
      for (lVar13 = lVar17; lVar13 < lVar25; lVar13 = lVar13 + 1) {
        dVar38 = 0.0;
        lVar14 = 0;
        for (uVar12 = uVar19; uVar27 != uVar12; uVar12 = uVar12 - 1) {
          dVar38 = dVar38 + *(double *)((long)pdVar11 + lVar14) *
                            *(double *)((long)pdVar30 + lVar14);
          lVar14 = lVar14 + __size;
        }
        lVar14 = 0;
        for (uVar12 = uVar19; uVar27 != uVar12; uVar12 = uVar12 - 1) {
          *(double *)((long)pdVar30 + lVar14) =
               *(double *)((long)pdVar11 + lVar14) * (dVar38 / (dVar41 * dVar34 - dVar39)) +
               *(double *)((long)pdVar30 + lVar14);
          lVar14 = lVar14 + __size;
        }
        pdVar30 = pdVar30 + 1;
      }
    }
    dVar39 = 0.0;
    in_R11 = uVar27 + 1;
    q[uVar27] = dVar34;
    for (lVar13 = lVar17; lVar13 < lVar25; lVar13 = lVar13 + 1) {
      dVar39 = dVar39 + local_78[lVar13] * local_78[lVar13];
    }
    dVar41 = 0.0;
    if (dVar33 * dVar33 <= dVar39) {
      dVar35 = U[uVar27 * lVar25 + in_R11];
      if (dVar39 < 0.0) {
        dVar34 = sqrt(dVar39);
      }
      else {
        dVar34 = SQRT(dVar39);
      }
      dVar41 = (double)(~-(ulong)(dVar35 < 0.0) & (ulong)-dVar34 |
                       -(ulong)(dVar35 < 0.0) & (ulong)dVar34);
      U[uVar27 * lVar25 + in_R11] = dVar35 - dVar41;
      for (lVar13 = lVar17; lVar14 = lVar17, lVar13 < lVar25; lVar13 = lVar13 + 1) {
        *(double *)((long)__ptr + lVar13 * 8) = local_78[lVar13] / (dVar35 * dVar41 - dVar39);
      }
      for (; lVar14 < lVar23; lVar14 = lVar14 + 1) {
        dVar35 = 0.0;
        pdVar30 = pdVar29;
        for (lVar13 = lVar17; lVar13 < lVar25; lVar13 = lVar13 + 1) {
          dVar35 = dVar35 + *pdVar30 * local_78[lVar13];
          pdVar30 = pdVar30 + 1;
        }
        for (lVar13 = 0; lVar17 + lVar13 < lVar25; lVar13 = lVar13 + 1) {
          pdVar29[lVar13] =
               *(double *)((long)__ptr + lVar13 * 8 + lVar17 * 8) * dVar35 + pdVar29[lVar13];
        }
        pdVar29 = pdVar29 + lVar25;
      }
      dVar34 = q[uVar27];
      dVar35 = *(double *)((long)__ptr + uVar27 * 8);
    }
    dVar39 = ABS(dVar35) + ABS(dVar34);
    if (ABS(dVar35) + ABS(dVar34) <= dVar40) {
      dVar39 = dVar40;
    }
    dVar40 = dVar39;
    iVar2 = iVar2 + 1;
    local_50 = local_50 - 1;
    pdVar11 = pdVar11 + lVar25 + 1;
    local_78 = local_78 + lVar25;
    uVar27 = in_R11;
    dVar35 = dVar41;
  }
  uVar27 = (ulong)(N + -1);
  lVar17 = lVar25 * uVar27;
  pdVar11 = U + lVar17;
  pdVar30 = V + uVar27;
  pdVar10 = V + lVar17;
  for (uVar19 = uVar27; -1 < (long)uVar19; uVar19 = uVar19 - 1) {
    uVar12 = uVar19 & 0xffffffff;
    if ((long)uVar19 < (long)uVar27) {
      if ((dVar35 != 0.0) || (NAN(dVar35))) {
        dVar39 = U[uVar19 + (long)((int)uVar19 * N) + 1];
        lVar14 = (long)(int)in_R11;
        pdVar29 = (double *)((long)pdVar30 + __size * lVar14);
        for (lVar13 = lVar14; lVar13 < lVar25; lVar13 = lVar13 + 1) {
          *pdVar29 = pdVar11[lVar13] / (dVar35 * dVar39);
          pdVar29 = pdVar29 + lVar25;
        }
        pdVar29 = (double *)(lVar9 * lVar14 + (long)V);
        for (lVar13 = lVar14; lVar13 < lVar25; lVar13 = lVar13 + 1) {
          dVar35 = 0.0;
          pdVar24 = pdVar29;
          for (lVar20 = lVar14; lVar20 < lVar25; lVar20 = lVar20 + 1) {
            dVar35 = dVar35 + pdVar11[lVar20] * *pdVar24;
            pdVar24 = pdVar24 + lVar25;
          }
          lVar21 = 0;
          for (lVar20 = lVar14; lVar20 < lVar25; lVar20 = lVar20 + 1) {
            *(double *)((long)pdVar29 + lVar21) =
                 *(double *)((long)pdVar30 + lVar21 + __size * lVar14) * dVar35 +
                 *(double *)((long)pdVar29 + lVar21);
            lVar21 = lVar21 + __size;
          }
          pdVar29 = pdVar29 + 1;
        }
      }
      lVar13 = (long)(int)in_R11;
      pdVar29 = (double *)(__size * lVar13 + (long)pdVar30);
      for (; lVar13 < lVar25; lVar13 = lVar13 + 1) {
        *pdVar29 = 0.0;
        pdVar10[lVar13] = 0.0;
        pdVar29 = pdVar29 + lVar25;
      }
    }
    V[uVar19 * lVar25 + uVar19] = 1.0;
    dVar35 = *(double *)((long)__ptr + uVar19 * 8);
    pdVar11 = pdVar11 + -lVar25;
    pdVar30 = pdVar30 + -1;
    pdVar10 = pdVar10 + -lVar25;
    in_R11 = uVar12;
  }
  pdVar11 = U + lVar17;
  pdVar30 = (double *)(lVar9 * uVar27 + (long)U);
  uVar3 = (N + 1) * N;
  uVar16 = ~N;
  uVar4 = uVar3 - 1;
  uVar5 = N * N;
  uVar6 = uVar5 - 1;
  iVar2 = N;
  for (uVar19 = uVar27; -1 < (long)uVar19; uVar19 = uVar19 - 1) {
    dVar35 = q[uVar19];
    if ((long)uVar19 < (long)uVar27) {
      for (lVar9 = (long)iVar2; lVar9 < lVar25; lVar9 = lVar9 + 1) {
        pdVar11[lVar9] = 0.0;
      }
    }
    if ((dVar35 != 0.0) || (pdVar10 = pdVar30, uVar12 = uVar19, NAN(dVar35))) {
      pdVar10 = pdVar30;
      uVar12 = uVar19;
      if (uVar19 != uVar27) {
        uVar28 = uVar19 & 0xffffffff;
        uVar22 = uVar5;
        uVar26 = uVar3;
        while (uVar7 = (int)uVar28 + 1, uVar28 = (ulong)uVar7, (int)uVar7 < N) {
          dVar39 = 0.0;
          uVar18 = uVar4;
          uVar7 = uVar26;
          for (iVar1 = iVar2; iVar1 < M; iVar1 = iVar1 + 1) {
            dVar39 = dVar39 + U[uVar18] * U[uVar7];
            uVar7 = uVar7 + N;
            uVar18 = uVar18 + N;
          }
          dVar34 = U[uVar19 + (long)((int)uVar19 * N)];
          uVar31 = uVar19 & 0xffffffff;
          uVar18 = uVar6;
          uVar7 = uVar22;
          while( true ) {
            if (M <= (int)uVar31) break;
            U[uVar7] = U[uVar18] * ((dVar39 / dVar34) / dVar35) + U[uVar7];
            uVar7 = uVar7 + N;
            uVar18 = uVar18 + N;
            uVar31 = (ulong)((int)uVar31 + 1);
          }
          uVar26 = uVar26 + 1;
          uVar22 = uVar22 + 1;
        }
      }
      for (; (long)uVar12 < lVar23; uVar12 = uVar12 + 1) {
        *pdVar10 = *pdVar10 / dVar35;
        pdVar10 = pdVar10 + lVar25;
      }
    }
    else {
      for (; (long)uVar12 < lVar23; uVar12 = uVar12 + 1) {
        *pdVar10 = 0.0;
        pdVar10 = pdVar10 + lVar25;
      }
    }
    U[uVar19 * lVar25 + uVar19] = U[uVar19 * lVar25 + uVar19] + 1.0;
    iVar2 = iVar2 + -1;
    pdVar11 = pdVar11 + -lVar25;
    pdVar30 = (double *)((long)pdVar30 + (__size ^ 0xfffffffffffffff8));
    uVar3 = uVar3 + uVar16;
    uVar4 = uVar4 + uVar16;
    uVar5 = uVar5 + uVar16;
    uVar6 = uVar6 + uVar16;
  }
  dVar33 = dVar33 * dVar40;
  uVar19 = 0;
  if (0 < M) {
    uVar19 = (ulong)(uint)M;
  }
  local_138 = V + uVar27;
LAB_0013bdf4:
  if ((long)uVar27 < 0) {
    svd_sort(U,M,N,V,q);
    free(__ptr);
    return 0;
  }
  uVar12 = uVar27 - 1;
  iVar2 = 0;
  do {
    if (iVar2 == 0x32) {
      puts("Convergence Not Achieved ");
      return 0xf;
    }
    iVar2 = iVar2 + 1;
    uVar31 = (long)(int)uVar27;
    for (uVar28 = uVar27; uVar4 = (uint)uVar28, -1 < (int)uVar4; uVar28 = uVar28 - 1) {
      if (ABS(*(double *)((long)__ptr + (uVar28 & 0xffffffff) * 8)) <= dVar33) goto LAB_0013bf97;
      if (ABS(q[(uVar28 & 0xffffffff) - 1]) <= dVar33) goto LAB_0013be74;
      uVar31 = uVar31 - 1;
    }
    uVar4 = 0xffffffff;
LAB_0013be74:
    if ((long)uVar28 < 0) {
      uVar28 = 0xffffffffffffffff;
    }
    lVar23 = uVar28 * 8;
    if ((long)uVar31 < 0) {
      uVar31 = 0xffffffffffffffff;
    }
    dVar35 = 0.0;
    dVar40 = 1.0;
    for (; (long)uVar28 <= (long)uVar27; uVar28 = uVar28 + 1) {
      dVar39 = *(double *)((long)__ptr + uVar28 * 8);
      dVar40 = dVar40 * dVar39;
      *(double *)((long)__ptr + uVar28 * 8) = dVar35 * dVar39;
      if (ABS(dVar40) <= dVar33) break;
      dVar35 = q[uVar28];
      dVar39 = hypot(dVar40,dVar35);
      q[uVar28] = dVar39;
      dVar35 = dVar35 / dVar39;
      dVar40 = -dVar40 / dVar39;
      pdVar11 = U;
      uVar15 = uVar19;
      while (bVar32 = uVar15 != 0, uVar15 = uVar15 - 1, bVar32) {
        dVar39 = pdVar11[uVar31 - 1];
        dVar34 = *(double *)((long)pdVar11 + lVar23);
        pdVar11[uVar31 - 1] = dVar39 * dVar35 + dVar40 * dVar34;
        *(double *)((long)pdVar11 + lVar23) = dVar34 * dVar35 - dVar40 * dVar39;
        pdVar11 = pdVar11 + lVar25;
      }
      lVar23 = lVar23 + 8;
    }
    uVar28 = (ulong)uVar4;
LAB_0013bf97:
    dVar35 = q[uVar27];
    if ((int)uVar28 == (int)uVar27) break;
    lVar17 = (long)(int)uVar28;
    dVar40 = q[lVar17];
    dVar39 = q[uVar12];
    dVar34 = *(double *)((long)__ptr + uVar12 * 8);
    dVar41 = *(double *)((long)__ptr + uVar27 * 8);
    dVar34 = ((dVar39 / dVar41 + ((dVar34 - dVar35) / dVar39) * ((dVar35 + dVar34) / dVar41)) -
             dVar41 / dVar39) * 0.5;
    dVar38 = hypot(dVar34,1.0);
    dVar34 = (dVar41 / dVar40) *
             (dVar39 / ((double)((ulong)-dVar38 & -(ulong)(dVar34 < 0.0) |
                                ~-(ulong)(dVar34 < 0.0) & (ulong)dVar38) + dVar34) - dVar41) +
             (dVar40 - (dVar35 / dVar40) * dVar35);
    pdVar11 = V + lVar17 + 1;
    lVar9 = lVar17 << 0x20;
    pdVar30 = U + lVar17 + 1;
    dVar35 = 1.0;
    dVar39 = 1.0;
    lVar23 = lVar17;
    while (lVar23 < (long)uVar27) {
      lVar13 = lVar23 + 1;
      dVar41 = *(double *)((long)__ptr + lVar13 * 8);
      dVar38 = q[lVar13];
      dVar39 = dVar39 * dVar41;
      dVar41 = dVar35 * dVar41;
      dVar36 = hypot(dVar34,dVar39);
      *(double *)((long)__ptr + lVar23 * 8) = dVar36;
      dVar34 = dVar34 / dVar36;
      dVar36 = dVar39 / dVar36;
      dVar39 = dVar38 * dVar36;
      lVar14 = lVar9;
      pdVar10 = pdVar11;
      uVar28 = uVar8;
      while (bVar32 = uVar28 != 0, uVar28 = uVar28 - 1, bVar32) {
        dVar35 = *(double *)((long)V + (lVar14 >> 0x1d));
        dVar37 = *pdVar10;
        *(double *)((long)V + (lVar14 >> 0x1d)) = dVar35 * dVar34 + dVar36 * dVar37;
        *pdVar10 = dVar37 * dVar34 - dVar36 * dVar35;
        pdVar10 = pdVar10 + lVar25;
        lVar14 = lVar14 + (lVar25 << 0x20);
      }
      dVar35 = dVar40 * dVar34 + dVar41 * dVar36;
      dVar37 = hypot(dVar35,dVar39);
      q[lVar23] = dVar37;
      dVar39 = dVar39 / dVar37;
      if ((dVar37 == 0.0) && (!NAN(dVar37))) {
        dVar39 = dVar36;
      }
      dVar35 = dVar35 / dVar37;
      if ((dVar37 == 0.0) && (!NAN(dVar37))) {
        dVar35 = dVar34;
      }
      dVar40 = dVar41 * dVar34 + -dVar40 * dVar36;
      dVar38 = dVar38 * dVar34;
      lVar23 = lVar9;
      pdVar10 = pdVar30;
      uVar28 = uVar19;
      while (bVar32 = uVar28 != 0, uVar28 = uVar28 - 1, bVar32) {
        dVar34 = *(double *)((long)U + (lVar23 >> 0x1d));
        dVar41 = *pdVar10;
        *(double *)((long)U + (lVar23 >> 0x1d)) = dVar34 * dVar35 + dVar39 * dVar41;
        *pdVar10 = dVar41 * dVar35 - dVar39 * dVar34;
        pdVar10 = pdVar10 + lVar25;
        lVar23 = lVar23 + (lVar25 << 0x20);
      }
      dVar34 = dVar40 * dVar35 + dVar38 * dVar39;
      dVar40 = dVar38 * dVar35 + -dVar39 * dVar40;
      pdVar11 = pdVar11 + 1;
      lVar9 = lVar9 + 0x100000000;
      pdVar30 = pdVar30 + 1;
      lVar23 = lVar13;
    }
    *(undefined8 *)((long)__ptr + lVar17 * 8) = 0;
    *(double *)((long)__ptr + uVar27 * 8) = dVar34;
    q[uVar27] = dVar40;
  } while( true );
  if (dVar35 < 0.0) {
    q[uVar27] = -dVar35;
    pdVar11 = local_138;
    uVar27 = uVar8;
    while (bVar32 = uVar27 != 0, uVar27 = uVar27 - 1, bVar32) {
      *pdVar11 = -*pdVar11;
      pdVar11 = pdVar11 + lVar25;
    }
  }
  local_138 = local_138 + -1;
  uVar27 = uVar12;
  goto LAB_0013bdf4;
}

Assistant:

int svd_gr2(double *A,int M,int N,double *U,double *V,double *q) {
	int i,j,k,l,t,t2,ierr,cancel,iter,l1;
	double eps,g,x,s,temp,f,h,tol,c,y,z;
	double *e;
	/*
     THIS SUBROUTINE IS THE MODIFIED C TRANSLATION OF THE
     EISPACK FORTRAN TRANSLATION OF THE ALGOL PROCEDURE SVD,
     NUM. MATH. 14, 403-420(1970) BY GOLUB AND REINSCH.
     HANDBOOK FOR AUTO. COMP., VOL II-LINEAR ALGEBRA, 134-151(1971).
	 */
	/*
	 * U = MXN
	 * V - NXN
	 * Q - NX1
	 */
	if (M < N) {
		printf("Rows (M) should be greater than Columns (B) \n");
		printf("Retry By Transposing the Input Matrix");
		return -1;
	}
	e = (double*) malloc(sizeof(double) * N);
	ierr = 0;
	eps = macheps();
	tol = eps * eps;
	g = x = 0.0;

	for(i = 0; i < M*N;++i) {
		U[i] = A[i];
	}

	for(i = 0; i < N;++i) {
		l = i+1;
		e[i] = g;
		s = 0.0;

		for(k = i; k < M;++k) {
			t = k * N;
			temp = U[t+i];
			s += temp*temp;
		}
		if (s < tol) {
			g = 0.0;
		} else {
			f = U[i*N+i];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
			U[i*N+i] = f - g;

			for(j = l; j < N;++j) {
				s = 0.0;
				for(k = i; k < M;++k) {
					t = k * N;
					s += (U[t+i]*U[t+j]);
				}
				f = s / h;
				for(k = i; k < M;++k) {
					t = k * N;
					U[t+j] += (f * U[t+i]);
				}
			}

		}

        q[i] = g;
        s = 0.0;
        t = i * N;
    	for(k = l; k < N;++k) {
    		temp = U[t+k];
    		s = s + temp*temp;
    	}
        if (s < tol) {
        	g = 0.0;
        } else {
        	f = U[t+l];
			g = (f < 0) ? sqrt(s) : -sqrt(s);
			h = f * g - s;
            U[t+l] = f - g;
            for(k = l;k < N;++k) {
              	e[k] = U[t+k] / h;
            }

            for (j = l; j < M; j++) {
                s = 0.0;
                t2 = j * N;
                for (k = l; k < N; k++) {
                     s += U[t2+k] * U[t+k];
                }
                for (k = l; k < N; k++) {
                     U[t2+k] += s * e[k];
                }
            }

        }

        temp = fabs(q[i]) + fabs(e[i]);

        if (x < temp) {
        	x = temp;
        }
	}


//Accumulating Right Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		if (i < N - 1) {
			if (g != 0.0) {
				h = U[t+i+1] * g;
				for(j = l;j < N;++j) {
					V[j*N+i] = U[t+j] / h;
				}
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < N;++k) {
						s += U[t+k] * V[k*N+j];
					}
					for(k = l; k < N;++k) {
						V[k*N+j] += (s * V[k*N+i]);
					}
				}
			}
			for(j = l; j < N;++j) {
				V[t+j] = V[j*N+i] = 0.0;
			}
		}
	    V[t+i] = 1.0;
		g = e[i];
		l = i;
	}



//Accumulating Left Hand Transformations

	for(i = N - 1;i >= 0;--i) {
		t = i * N;
		l = i+1;
		g = q[i];

		if (i < N - 1) {
			for(j = l;j < N;++j) {
				U[t+j] = 0.0;
			}
		}

		if (g != 0.0) {
			if (i != N - 1) {
				//h = U[t+i] * g;
				for(j = l;j < N;++j) {
					s = 0.0;
					for(k = l; k < M;++k) {
						s += (U[k*N+i] * U[k*N+j]);
					}
					f = (s / U[t+i]) / g;
					for(k = i; k < M;++k) {
						U[k*N+j] += (f * U[k*N+i]);
					}
				}
			}
			for(j = i; j < M;++j) {
				U[j*N+i] = U[j*N+i] / g;
			}
		} else {
			for(j = i; j < M;++j) {
				U[j*N+i] = 0.0;
			}
		}

		U[t+i] += 1.0;
	}
//	mdisplay(U,M,N);

	eps = eps * x;

	for(k = N - 1; k >= 0; --k) {
		iter = 0;

		while(1) {
			iter++;
			if (iter > SVDMAXITER) {
				printf("Convergence Not Achieved \n");
				return 15;
			}

			cancel = 1;
			for(l = k; l >= 0; --l) {
				if (fabs(e[l]) <= eps) {
					cancel = 0; //test f convergence
					break;
				}
				if (fabs(q[l-1]) <= eps) {
					//Cancel
					break;
				}
			}
			if (cancel) {
				c = 0.0;
				s = 1.0;
				l1 = l - 1;
				for(i = l; i <= k;++i) {
					f = s*e[i];
					e[i] *= c;
					if (fabs(f) <= eps) {
						break;
					}
					g = q[i];
					h = q[i] = hypot(f,g);
					c = g/h;
					s = -f/h;
					for(j = 0; j < M;++j) {
						t = j * N;
						y = U[t+l1];
						z = U[t+i];

						U[t+l1] = y * c + z * s;
						U[t+i] = z * c - y * s;
					}
				}
			}
			z = q[k];
			if (l != k) {
				x = q[l];
				y = q[k-1];
				g = e[k-1];
				h = e[k];
				f = 0.5 * (((g + z) / h) * ((g - z) / y) + y / h - h / y);
				g = hypot(f,1.0);
				if (f < 0.0) {
					temp = f - g;
				} else {
					temp = f+g;
				}
				f = x - (z / x) * z + (h / x) * (y / temp - h);

				//Next QR Transformation

				c = s = 1.0;
				for(i = l+1; i <= k;++i) {
					g = e[i];
					y = q[i];
					h = s * g;
					g = c * g;
					e[i-1] = z = hypot(f,h);
                    c = f / z;
                    s = h / z;
                    f = x * c + g * s;
                    g = g * c - x * s;
                    h = y * s;
                    y *= c;
                    for(j = 0; j < N;++j) {
                    	t = j * N;
                        x = V[t+i-1];
                        z = V[t+i];
                        V[t+i-1] = x * c + z * s;
                        V[t+i] = z * c - x * s;
                    }
                    q[i-1] = z = hypot(f,h);
                    if (z != 0.0) {
                        c = f / z;
                        s = h / z;
                    }
                    f = c * g + s * y;
                    x = c * y - s * g;
                    for(j = 0; j < M;++j) {
                    	t = j * N;
                        y = U[t+i-1];
                        z = U[t+i];
                        U[t+i-1] = y * c + z * s;
                        U[t+i] = z * c - y * s;
                    }
				}
                    e[l] = 0.0;
                    e[k] = f;
                    q[k] = x;

			} else {
				//convergence
                if (z < 0.0) {
                    q[k] = -z;
                    for (j = 0; j < N; j++) {
                    	t = j *N;
                        V[t+k] = -V[t+k];
                    }
                }
                break;
			}
		}
	}

	svd_sort(U,M,N,V,q);

	free(e);
	return ierr;
}